

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_basic_logger.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_30ceb::BasicLoggerThreadNameFixture::~BasicLoggerThreadNameFixture
          (BasicLoggerThreadNameFixture *this)

{
  not_null<const_char_*> local_18;
  
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__BasicLoggerThreadNameFixture_00253588;
  local_18.ptr_ = (this->old_name_)._M_dataplus._M_p;
  pstore::gsl::not_null<const_char_*>::ensure_invariant(&local_18);
  pstore::threads::set_name(local_18);
  std::__cxx11::string::~string((string *)&this->old_name_);
  testing::Test::~Test(&this->super_Test);
  return;
}

Assistant:

BasicLoggerThreadNameFixture::~BasicLoggerThreadNameFixture () {
        pstore::no_ex_escape ([this] () { pstore::threads::set_name (old_name_.c_str ()); });
    }